

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttpost.c
# Opt level: O0

void tt_face_free_ps_names(TT_Face face)

{
  FT_Memory memory_00;
  long lVar1;
  FT_Char **ppFVar2;
  TT_Post_25 table_1;
  TT_Post_20 table;
  FT_Fixed format;
  TT_Post_Names names;
  FT_Memory memory;
  TT_Face face_local;
  
  memory_00 = (face->root).memory;
  if ((face->postscript_names).loaded != '\0') {
    lVar1 = (face->postscript).FormatType;
    if (lVar1 == 0x20000) {
      ft_mem_free(memory_00,(face->postscript_names).names.format_20.glyph_indices);
      (face->postscript_names).names.format_20.glyph_indices = (FT_UShort *)0x0;
      (face->postscript_names).names.format_20.num_glyphs = 0;
      if ((face->postscript_names).names.format_20.num_names != 0) {
        ppFVar2 = (face->postscript_names).names.format_20.glyph_names;
        *ppFVar2 = *ppFVar2 + -1;
        ft_mem_free(memory_00,*(face->postscript_names).names.format_20.glyph_names);
        *(face->postscript_names).names.format_20.glyph_names = (FT_Char *)0x0;
        ft_mem_free(memory_00,(face->postscript_names).names.format_20.glyph_names);
        (face->postscript_names).names.format_20.glyph_names = (FT_Char **)0x0;
        (face->postscript_names).names.format_20.num_names = 0;
      }
    }
    else if (lVar1 == 0x25000) {
      ft_mem_free(memory_00,(face->postscript_names).names.format_20.glyph_indices);
      (face->postscript_names).names.format_20.glyph_indices = (FT_UShort *)0x0;
      (face->postscript_names).names.format_20.num_glyphs = 0;
    }
  }
  (face->postscript_names).loaded = '\0';
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  tt_face_free_ps_names( TT_Face  face )
  {
    FT_Memory      memory = face->root.memory;
    TT_Post_Names  names  = &face->postscript_names;
    FT_Fixed       format;


    if ( names->loaded )
    {
      format = face->postscript.FormatType;

      if ( format == 0x00020000L )
      {
        TT_Post_20  table = &names->names.format_20;


        FT_FREE( table->glyph_indices );
        table->num_glyphs = 0;

        if ( table->num_names )
        {
          table->glyph_names[0]--;
          FT_FREE( table->glyph_names[0] );

          FT_FREE( table->glyph_names );
          table->num_names = 0;
        }
      }
      else if ( format == 0x00025000L )
      {
        TT_Post_25  table = &names->names.format_25;


        FT_FREE( table->offsets );
        table->num_glyphs = 0;
      }
    }
    names->loaded = 0;
  }